

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jddctmgr.c
# Opt level: O0

void start_pass(j_decompress_ptr cinfo)

{
  J_DCT_METHOD JVar1;
  jpeg_inverse_dct *pjVar2;
  JQUANT_TBL *pJVar3;
  void *pvVar4;
  int iVar5;
  int local_60;
  int local_5c;
  int col;
  int row;
  FLOAT_MULT_TYPE *fmtbl;
  IFAST_MULT_TYPE *ifmtbl;
  ISLOW_MULT_TYPE *ismtbl;
  JQUANT_TBL *qtbl;
  inverse_DCT_method_ptr method_ptr;
  jpeg_component_info *pjStack_28;
  int method;
  jpeg_component_info *compptr;
  int i;
  int ci;
  my_idct_ptr idct;
  j_decompress_ptr cinfo_local;
  
  pjVar2 = cinfo->idct;
  method_ptr._4_4_ = 0;
  qtbl = (JQUANT_TBL *)0x0;
  compptr._4_4_ = 0;
  pjStack_28 = cinfo->comp_info;
  for (; compptr._4_4_ < cinfo->num_components; compptr._4_4_ = compptr._4_4_ + 1) {
    iVar5 = pjStack_28->DCT_h_scaled_size * 0x100 + pjStack_28->DCT_v_scaled_size;
    if (iVar5 == 0x101) {
      qtbl = (JQUANT_TBL *)jpeg_idct_1x1;
      method_ptr._4_4_ = 0;
    }
    else if (iVar5 == 0x102) {
      qtbl = (JQUANT_TBL *)jpeg_idct_1x2;
      method_ptr._4_4_ = 0;
    }
    else if (iVar5 == 0x201) {
      qtbl = (JQUANT_TBL *)jpeg_idct_2x1;
      method_ptr._4_4_ = 0;
    }
    else if (iVar5 == 0x202) {
      qtbl = (JQUANT_TBL *)jpeg_idct_2x2;
      method_ptr._4_4_ = 0;
    }
    else if (iVar5 == 0x204) {
      qtbl = (JQUANT_TBL *)jpeg_idct_2x4;
      method_ptr._4_4_ = 0;
    }
    else if (iVar5 == 0x303) {
      qtbl = (JQUANT_TBL *)jpeg_idct_3x3;
      method_ptr._4_4_ = 0;
    }
    else if (iVar5 == 0x306) {
      qtbl = (JQUANT_TBL *)jpeg_idct_3x6;
      method_ptr._4_4_ = 0;
    }
    else if (iVar5 == 0x402) {
      qtbl = (JQUANT_TBL *)jpeg_idct_4x2;
      method_ptr._4_4_ = 0;
    }
    else if (iVar5 == 0x404) {
      qtbl = (JQUANT_TBL *)jpeg_idct_4x4;
      method_ptr._4_4_ = 0;
    }
    else if (iVar5 == 0x408) {
      qtbl = (JQUANT_TBL *)jpeg_idct_4x8;
      method_ptr._4_4_ = 0;
    }
    else if (iVar5 == 0x505) {
      qtbl = (JQUANT_TBL *)jpeg_idct_5x5;
      method_ptr._4_4_ = 0;
    }
    else if (iVar5 == 0x50a) {
      qtbl = (JQUANT_TBL *)jpeg_idct_5x10;
      method_ptr._4_4_ = 0;
    }
    else if (iVar5 == 0x603) {
      qtbl = (JQUANT_TBL *)jpeg_idct_6x3;
      method_ptr._4_4_ = 0;
    }
    else if (iVar5 == 0x606) {
      qtbl = (JQUANT_TBL *)jpeg_idct_6x6;
      method_ptr._4_4_ = 0;
    }
    else if (iVar5 == 0x60c) {
      qtbl = (JQUANT_TBL *)jpeg_idct_6x12;
      method_ptr._4_4_ = 0;
    }
    else if (iVar5 == 0x707) {
      qtbl = (JQUANT_TBL *)jpeg_idct_7x7;
      method_ptr._4_4_ = 0;
    }
    else if (iVar5 == 0x70e) {
      qtbl = (JQUANT_TBL *)jpeg_idct_7x14;
      method_ptr._4_4_ = 0;
    }
    else if (iVar5 == 0x804) {
      qtbl = (JQUANT_TBL *)jpeg_idct_8x4;
      method_ptr._4_4_ = 0;
    }
    else if (iVar5 == 0x808) {
      JVar1 = cinfo->dct_method;
      if (JVar1 == JDCT_ISLOW) {
        qtbl = (JQUANT_TBL *)jpeg_idct_islow;
        method_ptr._4_4_ = 0;
      }
      else if (JVar1 == JDCT_IFAST) {
        qtbl = (JQUANT_TBL *)jpeg_idct_ifast;
        method_ptr._4_4_ = 1;
      }
      else if (JVar1 == JDCT_FLOAT) {
        qtbl = (JQUANT_TBL *)jpeg_idct_float;
        method_ptr._4_4_ = 2;
      }
      else {
        cinfo->err->msg_code = 0x31;
        (*cinfo->err->error_exit)((j_common_ptr)cinfo);
      }
    }
    else if (iVar5 == 0x810) {
      qtbl = (JQUANT_TBL *)jpeg_idct_8x16;
      method_ptr._4_4_ = 0;
    }
    else if (iVar5 == 0x909) {
      qtbl = (JQUANT_TBL *)jpeg_idct_9x9;
      method_ptr._4_4_ = 0;
    }
    else if (iVar5 == 0xa05) {
      qtbl = (JQUANT_TBL *)jpeg_idct_10x5;
      method_ptr._4_4_ = 0;
    }
    else if (iVar5 == 0xa0a) {
      qtbl = (JQUANT_TBL *)jpeg_idct_10x10;
      method_ptr._4_4_ = 0;
    }
    else if (iVar5 == 0xb0b) {
      qtbl = (JQUANT_TBL *)jpeg_idct_11x11;
      method_ptr._4_4_ = 0;
    }
    else if (iVar5 == 0xc06) {
      qtbl = (JQUANT_TBL *)jpeg_idct_12x6;
      method_ptr._4_4_ = 0;
    }
    else if (iVar5 == 0xc0c) {
      qtbl = (JQUANT_TBL *)jpeg_idct_12x12;
      method_ptr._4_4_ = 0;
    }
    else if (iVar5 == 0xd0d) {
      qtbl = (JQUANT_TBL *)jpeg_idct_13x13;
      method_ptr._4_4_ = 0;
    }
    else if (iVar5 == 0xe07) {
      qtbl = (JQUANT_TBL *)jpeg_idct_14x7;
      method_ptr._4_4_ = 0;
    }
    else if (iVar5 == 0xe0e) {
      qtbl = (JQUANT_TBL *)jpeg_idct_14x14;
      method_ptr._4_4_ = 0;
    }
    else if (iVar5 == 0xf0f) {
      qtbl = (JQUANT_TBL *)jpeg_idct_15x15;
      method_ptr._4_4_ = 0;
    }
    else if (iVar5 == 0x1008) {
      qtbl = (JQUANT_TBL *)jpeg_idct_16x8;
      method_ptr._4_4_ = 0;
    }
    else if (iVar5 == 0x1010) {
      qtbl = (JQUANT_TBL *)jpeg_idct_16x16;
      method_ptr._4_4_ = 0;
    }
    else {
      cinfo->err->msg_code = 7;
      (cinfo->err->msg_parm).i[0] = pjStack_28->DCT_h_scaled_size;
      (cinfo->err->msg_parm).i[1] = pjStack_28->DCT_v_scaled_size;
      (*cinfo->err->error_exit)((j_common_ptr)cinfo);
    }
    pjVar2->inverse_DCT[compptr._4_4_] = (inverse_DCT_method_ptr)qtbl;
    if (((pjStack_28->component_needed != 0) &&
        (*(int *)((long)pjVar2[1].inverse_DCT + (long)compptr._4_4_ * 4 + -8) != method_ptr._4_4_))
       && (pJVar3 = pjStack_28->quant_table, pJVar3 != (JQUANT_TBL *)0x0)) {
      *(int *)((long)pjVar2[1].inverse_DCT + (long)compptr._4_4_ * 4 + -8) = method_ptr._4_4_;
      if (method_ptr._4_4_ == 0) {
        pvVar4 = pjStack_28->dct_table;
        for (compptr._0_4_ = 0; (int)compptr < 0x40; compptr._0_4_ = (int)compptr + 1) {
          *(uint *)((long)pvVar4 + (long)(int)compptr * 4) = (uint)pJVar3->quantval[(int)compptr];
        }
      }
      else if (method_ptr._4_4_ == 1) {
        pvVar4 = pjStack_28->dct_table;
        for (compptr._0_4_ = 0; (int)compptr < 0x40; compptr._0_4_ = (int)compptr + 1) {
          *(int *)((long)pvVar4 + (long)(int)compptr * 4) =
               (int)((long)((ulong)pJVar3->quantval[(int)compptr] *
                            (long)start_pass::aanscales[(int)compptr] + 0x800) >> 0xc);
        }
      }
      else if (method_ptr._4_4_ == 2) {
        pvVar4 = pjStack_28->dct_table;
        compptr._0_4_ = 0;
        for (local_5c = 0; local_5c < 8; local_5c = local_5c + 1) {
          for (local_60 = 0; local_60 < 8; local_60 = local_60 + 1) {
            *(float *)((long)pvVar4 + (long)(int)compptr * 4) =
                 (float)((double)pJVar3->quantval[(int)compptr] *
                         start_pass::aanscalefactor[local_5c] * start_pass::aanscalefactor[local_60]
                        * 0.125);
            compptr._0_4_ = (int)compptr + 1;
          }
        }
      }
      else {
        cinfo->err->msg_code = 0x31;
        (*cinfo->err->error_exit)((j_common_ptr)cinfo);
      }
    }
    pjStack_28 = pjStack_28 + 1;
  }
  return;
}

Assistant:

METHODDEF(void)
start_pass (j_decompress_ptr cinfo)
{
  my_idct_ptr idct = (my_idct_ptr) cinfo->idct;
  int ci, i;
  jpeg_component_info *compptr;
  int method = 0;
  inverse_DCT_method_ptr method_ptr = NULL;
  JQUANT_TBL * qtbl;

  for (ci = 0, compptr = cinfo->comp_info; ci < cinfo->num_components;
       ci++, compptr++) {
    /* Select the proper IDCT routine for this component's scaling */
    switch ((compptr->DCT_h_scaled_size << 8) + compptr->DCT_v_scaled_size) {
#ifdef IDCT_SCALING_SUPPORTED
    case ((1 << 8) + 1):
      method_ptr = jpeg_idct_1x1;
      method = JDCT_ISLOW;	/* jidctint uses islow-style table */
      break;
    case ((2 << 8) + 2):
      method_ptr = jpeg_idct_2x2;
      method = JDCT_ISLOW;	/* jidctint uses islow-style table */
      break;
    case ((3 << 8) + 3):
      method_ptr = jpeg_idct_3x3;
      method = JDCT_ISLOW;	/* jidctint uses islow-style table */
      break;
    case ((4 << 8) + 4):
      method_ptr = jpeg_idct_4x4;
      method = JDCT_ISLOW;	/* jidctint uses islow-style table */
      break;
    case ((5 << 8) + 5):
      method_ptr = jpeg_idct_5x5;
      method = JDCT_ISLOW;	/* jidctint uses islow-style table */
      break;
    case ((6 << 8) + 6):
      method_ptr = jpeg_idct_6x6;
      method = JDCT_ISLOW;	/* jidctint uses islow-style table */
      break;
    case ((7 << 8) + 7):
      method_ptr = jpeg_idct_7x7;
      method = JDCT_ISLOW;	/* jidctint uses islow-style table */
      break;
    case ((9 << 8) + 9):
      method_ptr = jpeg_idct_9x9;
      method = JDCT_ISLOW;	/* jidctint uses islow-style table */
      break;
    case ((10 << 8) + 10):
      method_ptr = jpeg_idct_10x10;
      method = JDCT_ISLOW;	/* jidctint uses islow-style table */
      break;
    case ((11 << 8) + 11):
      method_ptr = jpeg_idct_11x11;
      method = JDCT_ISLOW;	/* jidctint uses islow-style table */
      break;
    case ((12 << 8) + 12):
      method_ptr = jpeg_idct_12x12;
      method = JDCT_ISLOW;	/* jidctint uses islow-style table */
      break;
    case ((13 << 8) + 13):
      method_ptr = jpeg_idct_13x13;
      method = JDCT_ISLOW;	/* jidctint uses islow-style table */
      break;
    case ((14 << 8) + 14):
      method_ptr = jpeg_idct_14x14;
      method = JDCT_ISLOW;	/* jidctint uses islow-style table */
      break;
    case ((15 << 8) + 15):
      method_ptr = jpeg_idct_15x15;
      method = JDCT_ISLOW;	/* jidctint uses islow-style table */
      break;
    case ((16 << 8) + 16):
      method_ptr = jpeg_idct_16x16;
      method = JDCT_ISLOW;	/* jidctint uses islow-style table */
      break;
    case ((16 << 8) + 8):
      method_ptr = jpeg_idct_16x8;
      method = JDCT_ISLOW;	/* jidctint uses islow-style table */
      break;
    case ((14 << 8) + 7):
      method_ptr = jpeg_idct_14x7;
      method = JDCT_ISLOW;	/* jidctint uses islow-style table */
      break;
    case ((12 << 8) + 6):
      method_ptr = jpeg_idct_12x6;
      method = JDCT_ISLOW;	/* jidctint uses islow-style table */
      break;
    case ((10 << 8) + 5):
      method_ptr = jpeg_idct_10x5;
      method = JDCT_ISLOW;	/* jidctint uses islow-style table */
      break;
    case ((8 << 8) + 4):
      method_ptr = jpeg_idct_8x4;
      method = JDCT_ISLOW;	/* jidctint uses islow-style table */
      break;
    case ((6 << 8) + 3):
      method_ptr = jpeg_idct_6x3;
      method = JDCT_ISLOW;	/* jidctint uses islow-style table */
      break;
    case ((4 << 8) + 2):
      method_ptr = jpeg_idct_4x2;
      method = JDCT_ISLOW;	/* jidctint uses islow-style table */
      break;
    case ((2 << 8) + 1):
      method_ptr = jpeg_idct_2x1;
      method = JDCT_ISLOW;	/* jidctint uses islow-style table */
      break;
    case ((8 << 8) + 16):
      method_ptr = jpeg_idct_8x16;
      method = JDCT_ISLOW;	/* jidctint uses islow-style table */
      break;
    case ((7 << 8) + 14):
      method_ptr = jpeg_idct_7x14;
      method = JDCT_ISLOW;	/* jidctint uses islow-style table */
      break;
    case ((6 << 8) + 12):
      method_ptr = jpeg_idct_6x12;
      method = JDCT_ISLOW;	/* jidctint uses islow-style table */
      break;
    case ((5 << 8) + 10):
      method_ptr = jpeg_idct_5x10;
      method = JDCT_ISLOW;	/* jidctint uses islow-style table */
      break;
    case ((4 << 8) + 8):
      method_ptr = jpeg_idct_4x8;
      method = JDCT_ISLOW;	/* jidctint uses islow-style table */
      break;
    case ((3 << 8) + 6):
      method_ptr = jpeg_idct_3x6;
      method = JDCT_ISLOW;	/* jidctint uses islow-style table */
      break;
    case ((2 << 8) + 4):
      method_ptr = jpeg_idct_2x4;
      method = JDCT_ISLOW;	/* jidctint uses islow-style table */
      break;
    case ((1 << 8) + 2):
      method_ptr = jpeg_idct_1x2;
      method = JDCT_ISLOW;	/* jidctint uses islow-style table */
      break;
#endif
    case ((DCTSIZE << 8) + DCTSIZE):
      switch (cinfo->dct_method) {
#ifdef DCT_ISLOW_SUPPORTED
      case JDCT_ISLOW:
	method_ptr = jpeg_idct_islow;
	method = JDCT_ISLOW;
	break;
#endif
#ifdef DCT_IFAST_SUPPORTED
      case JDCT_IFAST:
	method_ptr = jpeg_idct_ifast;
	method = JDCT_IFAST;
	break;
#endif
#ifdef DCT_FLOAT_SUPPORTED
      case JDCT_FLOAT:
	method_ptr = jpeg_idct_float;
	method = JDCT_FLOAT;
	break;
#endif
      default:
	ERREXIT(cinfo, JERR_NOT_COMPILED);
	break;
      }
      break;
    default:
      ERREXIT2(cinfo, JERR_BAD_DCTSIZE,
	       compptr->DCT_h_scaled_size, compptr->DCT_v_scaled_size);
      break;
    }
    idct->pub.inverse_DCT[ci] = method_ptr;
    /* Create multiplier table from quant table.
     * However, we can skip this if the component is uninteresting
     * or if we already built the table.  Also, if no quant table
     * has yet been saved for the component, we leave the
     * multiplier table all-zero; we'll be reading zeroes from the
     * coefficient controller's buffer anyway.
     */
    if (! compptr->component_needed || idct->cur_method[ci] == method)
      continue;
    qtbl = compptr->quant_table;
    if (qtbl == NULL)		/* happens if no data yet for component */
      continue;
    idct->cur_method[ci] = method;
    switch (method) {
#ifdef PROVIDE_ISLOW_TABLES
    case JDCT_ISLOW:
      {
	/* For LL&M IDCT method, multipliers are equal to raw quantization
	 * coefficients, but are stored as ints to ensure access efficiency.
	 */
	ISLOW_MULT_TYPE * ismtbl = (ISLOW_MULT_TYPE *) compptr->dct_table;
	for (i = 0; i < DCTSIZE2; i++) {
	  ismtbl[i] = (ISLOW_MULT_TYPE) qtbl->quantval[i];
	}
      }
      break;
#endif
#ifdef DCT_IFAST_SUPPORTED
    case JDCT_IFAST:
      {
	/* For AA&N IDCT method, multipliers are equal to quantization
	 * coefficients scaled by scalefactor[row]*scalefactor[col], where
	 *   scalefactor[0] = 1
	 *   scalefactor[k] = cos(k*PI/16) * sqrt(2)    for k=1..7
	 * For integer operation, the multiplier table is to be scaled by
	 * IFAST_SCALE_BITS.
	 */
	IFAST_MULT_TYPE * ifmtbl = (IFAST_MULT_TYPE *) compptr->dct_table;
#define CONST_BITS 14
	static const INT16 aanscales[DCTSIZE2] = {
	  /* precomputed values scaled up by 14 bits */
	  16384, 22725, 21407, 19266, 16384, 12873,  8867,  4520,
	  22725, 31521, 29692, 26722, 22725, 17855, 12299,  6270,
	  21407, 29692, 27969, 25172, 21407, 16819, 11585,  5906,
	  19266, 26722, 25172, 22654, 19266, 15137, 10426,  5315,
	  16384, 22725, 21407, 19266, 16384, 12873,  8867,  4520,
	  12873, 17855, 16819, 15137, 12873, 10114,  6967,  3552,
	   8867, 12299, 11585, 10426,  8867,  6967,  4799,  2446,
	   4520,  6270,  5906,  5315,  4520,  3552,  2446,  1247
	};
	SHIFT_TEMPS

	for (i = 0; i < DCTSIZE2; i++) {
	  ifmtbl[i] = (IFAST_MULT_TYPE)
	    DESCALE(MULTIPLY16V16((INT32) qtbl->quantval[i],
				  (INT32) aanscales[i]),
		    CONST_BITS-IFAST_SCALE_BITS);
	}
      }
      break;
#endif
#ifdef DCT_FLOAT_SUPPORTED
    case JDCT_FLOAT:
      {
	/* For float AA&N IDCT method, multipliers are equal to quantization
	 * coefficients scaled by scalefactor[row]*scalefactor[col], where
	 *   scalefactor[0] = 1
	 *   scalefactor[k] = cos(k*PI/16) * sqrt(2)    for k=1..7
	 * We apply a further scale factor of 1/8.
	 */
	FLOAT_MULT_TYPE * fmtbl = (FLOAT_MULT_TYPE *) compptr->dct_table;
	int row, col;
	static const double aanscalefactor[DCTSIZE] = {
	  1.0, 1.387039845, 1.306562965, 1.175875602,
	  1.0, 0.785694958, 0.541196100, 0.275899379
	};

	i = 0;
	for (row = 0; row < DCTSIZE; row++) {
	  for (col = 0; col < DCTSIZE; col++) {
	    fmtbl[i] = (FLOAT_MULT_TYPE)
	      ((double) qtbl->quantval[i] *
	       aanscalefactor[row] * aanscalefactor[col] * 0.125);
	    i++;
	  }
	}
      }
      break;
#endif
    default:
      ERREXIT(cinfo, JERR_NOT_COMPILED);
      break;
    }
  }
}